

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O1

error_code __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::init_asio
          (connection<websocketpp::config::asio::transport_config> *this,io_service_ptr io_service)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  strand *psVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  error_code eVar4;
  undefined1 local_49;
  strand_ptr local_48;
  strand *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  reference_wrapper<asio::io_context> local_20;
  
  this->m_io_service = io_service;
  local_38 = (element_type *)0x0;
  local_20._M_data = io_service;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<asio::io_context::strand,std::allocator<asio::io_context::strand>,std::reference_wrapper<asio::io_context>>
            (a_Stack_30,&local_38,(allocator<asio::io_context::strand> *)&local_49,&local_20);
  _Var3._M_pi = a_Stack_30[0]._M_pi;
  psVar2 = local_38;
  local_38 = (strand *)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->m_strand).super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->m_strand).super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       psVar2;
  (this->m_strand).super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
  }
  p_Var1 = (this->m_strand).super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  local_48.super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->m_strand).super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_48.super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (this->m_strand).super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  eVar4 = basic_socket::connection::init_asio
                    (&this->super_socket_con_type,io_service,&local_48,this->m_is_server);
  if (local_48.super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  eVar4._4_4_ = 0;
  return eVar4;
}

Assistant:

lib::error_code init_asio (io_service_ptr io_service) {
        m_io_service = io_service;

        if (config::enable_multithreading) {
            m_strand = lib::make_shared<lib::asio::io_service::strand>(
                lib::ref(*io_service));
        }

        lib::error_code ec = socket_con_type::init_asio(io_service, m_strand,
            m_is_server);

        return ec;
    }